

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateJsonNameConflictProto2Legacy_Test
::TestBody(ValidationErrorTest_ValidateJsonNameConflictProto2Legacy_Test *this)

{
  string_view file_text;
  
  file_text._M_str =
       "name: \'foo.proto\' syntax: \'proto2\' message_type {  name: \'Foo\'  options { deprecated_legacy_json_field_conflicts: true }  field { name:\'AB\' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }  field { name:\'_a__b_\' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }}"
  ;
  file_text._M_len = 0x103;
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateJsonNameConflictProto2Legacy) {
  BuildFile(
      "name: 'foo.proto' "
      "syntax: 'proto2' "
      "message_type {"
      "  name: 'Foo'"
      "  options { deprecated_legacy_json_field_conflicts: true }"
      "  field { name:'AB' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "  field { name:'_a__b_' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "}");
}